

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmGoto::gen_code(CTPNStmGoto *this,int param_2,int param_3)

{
  tc_symtype_t tVar1;
  int iVar2;
  CTcPrsSymtab *pCVar3;
  CTcSymLabelBase *this_00;
  CTPNStmEnclosing *pCVar4;
  undefined4 in_EDX;
  undefined4 in_ESI;
  CTcCodeStream *in_RDI;
  CTPNStmEnclosing *enc;
  CTPNStmLabel *label_stm;
  CTcSymbol *sym;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  textchar_t *in_stack_ffffffffffffffc8;
  CTcCodeStream *lbl;
  CTPNStmLabel *local_28;
  CTPNStmLabel *pCVar5;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_RDI);
  pCVar3 = CTcCodeStream::get_goto_symtab(G_cs);
  if (pCVar3 != (CTcPrsSymtab *)0x0) {
    CTcCodeStream::get_goto_symtab(G_cs);
    this_00 = (CTcSymLabelBase *)
              CTcPrsSymtab::find((CTcPrsSymtab *)in_RDI,in_stack_ffffffffffffffc8,0x28b529);
    if (((this_00 != (CTcSymLabelBase *)0x0) &&
        (tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_00), tVar1 == TC_SYM_LABEL)) &&
       (local_28 = CTcSymLabelBase::get_stm(this_00), local_28 != (CTPNStmLabel *)0x0)) {
      pCVar4 = CTcCodeStream::get_enclosing(G_cs);
      pCVar5 = local_28;
      if (pCVar4 == (CTPNStmEnclosing *)0x0) {
        while ((local_28 != (CTPNStmLabel *)0x0 &&
               (iVar2 = (*(local_28->super_CTPNStmLabelBase).super_CTPNStmEnclosing.super_CTPNStm.
                          super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
                          _vptr_CTcPrsNodeBase[0x24])(local_28,in_RDI,pCVar5), iVar2 != 0))) {
          local_28 = (CTPNStmLabel *)CTPNStmEnclosing::get_enclosing((CTPNStmEnclosing *)local_28);
        }
      }
      else {
        CTcCodeStream::get_enclosing(G_cs);
        CTPNStmEnclosing::gen_code_unwind_for_goto
                  ((CTPNStmEnclosing *)CONCAT44(in_ESI,in_EDX),(CTPNStmGoto *)this_00,local_28);
      }
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      lbl = G_cs;
      CTPNStmLabel::get_goto_label((CTPNStmLabel *)in_RDI);
      CTcCodeStream::write_ofs2(in_RDI,(CTcCodeLabel *)lbl,0);
      return;
    }
  }
  CTPNStmBase::log_error
            ((CTPNStmBase *)in_RDI,0x2d0a,
             (ulong)(in_RDI->super_CTcDataStream).page_cur_ & 0xffffffff,
             (CTcPrsSymtab *)(in_RDI->super_CTcDataStream).rem_);
  return;
}

Assistant:

void CTPNStmGoto::gen_code(int, int)
{
    CTcSymbol *sym;
    CTPNStmLabel *label_stm;
    
    /* add a line record */
    add_debug_line_rec();

    /* 
     *   look up our label symbol in the 'goto' table for the function,
     *   and get the label statement node from the label 
     */
    if (G_cs->get_goto_symtab() == 0
        || (sym = G_cs->get_goto_symtab()->find(lbl_, lbl_len_)) == 0
        || sym->get_type() != TC_SYM_LABEL
        || (label_stm = ((CTcSymLabel *)sym)->get_stm()) == 0)
    {
        /* log an error */
        log_error(TCERR_INVALID_GOTO_LBL, (int)lbl_len_, lbl_);

        /* give up */
        return;
    }

    /*
     *   Tell any enclosing statements to unwind their 'try' blocks for a
     *   transfer to the given label.  We only need to go as far as the
     *   most deeply nested enclosing statement we have in common with the
     *   label, because we'll be transferring control entirely within the
     *   confines of that enclosing statement.  
     */
    if (G_cs->get_enclosing() != 0)
    {
        /* generate the unwinding code */
        G_cs->get_enclosing()->gen_code_unwind_for_goto(this, label_stm);
    }
    else
    {
        CTPNStmEnclosing *enc;
        
        /*
         *   The 'goto' isn't enclosed in any statements.  This means that
         *   we are entering every block that contains the target label.
         *   Some blocks don't allow entering via 'goto', so we must check
         *   at this point to see if any of the enclosing blocks are
         *   problematic. 
         */
        for (enc = label_stm ; enc != 0 ; enc = enc->get_enclosing())
        {
            /* 
             *   make sure we're allowed to enter this statement - if not,
             *   stop scanning, so that we display only one such error 
             */
            if (!enc->check_enter_by_goto(this, label_stm))
                break;
        }
    }

    /* generate a jump to the label */
    G_cg->write_op(OPC_JMP);
    G_cs->write_ofs2(label_stm->get_goto_label(), 0);
}